

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixfork.c
# Opt level: O2

int fork_Unix(void)

{
  char cVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  __pid_t _Var5;
  int iVar6;
  time_t tVar7;
  ssize_t sVar8;
  int *piVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  ulong c;
  long lVar13;
  uint __status;
  char *pcVar14;
  char *__s1;
  unsigned_short tmp;
  char IOBuf [6];
  int UnixToLisp [2];
  int LispToUnix [2];
  char *local_1a8;
  char *pcStack_1a0;
  char *local_198;
  undefined8 uStack_190;
  char slavepty [32];
  char tempstring [30];
  termios tio;
  sigset_t signals;
  
  tmp = 0;
  iVar3 = pipe(LispToUnix);
  if ((iVar3 == -1) || (iVar3 = pipe(UnixToLisp), iVar3 == -1)) {
    pcVar14 = "pipe";
  }
  else {
    tVar7 = time((time_t *)0x0);
    StartTime = (long)((uint)tVar7 & 0xffffff);
    sigemptyset((sigset_t *)&signals);
    sigaddset((sigset_t *)&signals,0x1a);
    sigaddset((sigset_t *)&signals,0x1d);
    sigaddset((sigset_t *)&signals,0xe);
    sigaddset((sigset_t *)&signals,0x19);
    sigaddset((sigset_t *)&signals,8);
    sigprocmask(0,(sigset_t *)&signals,(sigset_t *)0x0);
    uVar4 = fork();
    if (uVar4 == 0) {
      close(LispToUnix[1]);
      close(UnixToLisp[0]);
      uVar4 = fcntl(LispToUnix[0],3,0);
      fcntl(LispToUnix[0],4,(ulong)(uVar4 & 0xfffff7ff));
      do {
        sVar8 = SAFEREAD(LispToUnix[0],IOBuf,6);
        cVar2 = IOBuf[3];
        if (sVar8 == 0) {
          exit(0);
        }
        if (sVar8 < 0) {
          pcVar14 = "Error reading packet by slave";
          goto LAB_00102aed;
        }
        if (sVar8 != 6) goto LAB_00102af2;
        uVar12 = (ulong)(byte)IOBuf[3];
        IOBuf[3] = '\x01';
        cVar1 = IOBuf[0];
        if (IOBuf[0] == 'F') {
          if (cVar2 < '\0') {
            puts("No process slots available.");
          }
          else {
            sVar8 = SAFEREAD(LispToUnix[0],(char *)&tmp,2);
            if (sVar8 < 0) {
              perror("Slave reading cmd length");
            }
            c = (ulong)tmp;
            pcVar14 = shcom;
            if (0x1fe < c) {
              pcVar14 = (char *)malloc(c + 5);
            }
            sVar8 = SAFEREAD(LispToUnix[0],pcVar14,c);
            if (sVar8 < 0) {
              perror("Slave reading cmd");
            }
            _Var5 = fork();
            if (_Var5 != -1) {
              if (_Var5 != 0) {
                IOBuf[1] = (char)((uint)_Var5 >> 8);
                IOBuf[2] = (char)_Var5;
                IOBuf[4] = (char)((uint)_Var5 >> 0x10);
                IOBuf[5] = (char)((uint)_Var5 >> 0x18);
                goto LAB_00102a1e;
              }
              iVar3 = socket(1,1,0);
              if (iVar3 < 0) {
                pcVar14 = "slave socket";
                goto LAB_00102aed;
              }
              snprintf((char *)&tio,0x28,"/tmp/LPU%ld-%d",StartTime,uVar12);
              tempstring[2] = '\0';
              tempstring[3] = '\0';
              tempstring[4] = '\0';
              tempstring[5] = '\0';
              tempstring[6] = '\0';
              tempstring[7] = '\0';
              tempstring[8] = '\0';
              tempstring[9] = '\0';
              tempstring[10] = '\0';
              tempstring[0xb] = '\0';
              tempstring[0xc] = '\0';
              tempstring[0xd] = '\0';
              tempstring[0xe] = '\0';
              tempstring[0xf] = '\0';
              tempstring[0x10] = '\0';
              tempstring[0x11] = '\0';
              tempstring[0x12] = '\0';
              tempstring[0x13] = '\0';
              tempstring[0x14] = '\0';
              tempstring[0x15] = '\0';
              tempstring[0x16] = '\0';
              tempstring[0x17] = '\0';
              tempstring[0x18] = '\0';
              tempstring[0x19] = '\0';
              stack0xfffffffffffffeb2 = 0;
              tempstring[0] = '\x01';
              tempstring[1] = '\0';
              strcpy(tempstring + 2,(char *)&tio);
              iVar6 = connect(iVar3,(sockaddr *)tempstring,0x6e);
              if (-1 < iVar6) {
                dup2(iVar3,0);
                dup2(iVar3,1);
                dup2(iVar3,2);
                for (lVar13 = 3; lVar11 = sysconf(4), lVar13 < lVar11; lVar13 = lVar13 + 1) {
                  close((int)lVar13);
                }
                uVar4 = system(pcVar14);
                if (pcVar14 != shcom) {
                  free(pcVar14);
                }
                __status = (int)uVar4 >> 8;
                if (uVar4 < 0x100) {
                  __status = uVar4;
                }
                _exit(__status);
              }
              perror("slave connect");
              printf("Name = %s.\n",&tio);
              fflush(_stdout);
              goto LAB_00102af2;
            }
            perror("unixcomm: fork");
          }
LAB_00102a19:
          IOBuf[3] = '\0';
        }
        else {
          if (IOBuf[0] == 'P') {
LAB_0010279f:
            if (cVar2 < '\0') {
              pcVar14 = "Can\'t get process slot for PTY shell.";
            }
            else {
              sVar8 = SAFEREAD(LispToUnix[0],(char *)&tmp,2);
              if (sVar8 < 0) {
                perror("Slave reading slave pty len");
              }
              sVar8 = SAFEREAD(LispToUnix[0],slavepty,(ulong)tmp);
              if (sVar8 < 0) {
                perror("Slave reading slave pty id");
              }
              if (cVar1 == 'P') {
                sVar8 = SAFEREAD(LispToUnix[0],(char *)&tmp,2);
                if (sVar8 < 0) {
                  perror("Slave reading cmd length");
                }
                uVar12 = (ulong)tmp;
                if (0x3f < uVar12) {
                  perror("Slave termtype length too long");
                }
                sVar8 = SAFEREAD(LispToUnix[0],tempstring,uVar12);
                if (sVar8 < 0) {
                  perror("Slave reading termtype");
                }
                tempstring[uVar12] = '\0';
                sVar8 = SAFEREAD(LispToUnix[0],(char *)&tmp,2);
                if (sVar8 < 0) {
                  perror("Slave reading cmd length");
                }
                uVar12 = (ulong)tmp;
                pcVar14 = shcom;
                if (0x1fe < uVar12) {
                  pcVar14 = (char *)malloc(uVar12 + 5);
                }
                sVar8 = SAFEREAD(LispToUnix[0],pcVar14,uVar12);
                if (sVar8 < 0) {
                  perror("Slave reading shcom");
                }
              }
              else {
                tempstring[0] = '\0';
                shcom[0] = '\0';
                pcVar14 = shcom;
              }
              local_198 = (char *)0x0;
              uStack_190 = 0;
              local_1a8 = (char *)0x0;
              pcStack_1a0 = (char *)0x0;
              _Var5 = fork();
              if (_Var5 == 0) {
                _Var5 = setsid();
                if (_Var5 < 0) {
                  perror("setsid");
                }
                iVar3 = open(slavepty,2);
                if (iVar3 == -1) {
                  perror("Slave Open");
                  pcVar14 = slavepty;
                  goto LAB_00102aed;
                }
                tcgetattr(iVar3,(termios *)&tio);
                tio.c_lflag = tio.c_lflag | 0xa1a;
                tcsetattr(iVar3,0,(termios *)&tio);
                dup2(iVar3,0);
                dup2(iVar3,1);
                dup2(iVar3,2);
                close(iVar3);
                setenv("LDESHELL","YES",1);
                if (tempstring[0] != '\0') {
                  setenv("TERM",tempstring,1);
                }
                pcVar10 = getenv("SHELL");
                __s1 = "/bin/sh";
                if (pcVar10 != (char *)0x0) {
                  __s1 = pcVar10;
                }
                goto LAB_00102bca;
              }
              if (pcVar14 != shcom) {
                free(pcVar14);
              }
              if (_Var5 != -1) {
                IOBuf[1] = (char)((uint)_Var5 >> 8);
                IOBuf[2] = (char)_Var5;
                IOBuf[4] = (char)((uint)_Var5 >> 0x10);
                IOBuf[5] = (char)((uint)_Var5 >> 0x18);
                goto LAB_00102a1e;
              }
              pcVar14 = "Impossible failure from ForkUnixShell??";
            }
            puts(pcVar14);
            fflush(_stdout);
            goto LAB_00102a19;
          }
          if (IOBuf[0] == 'W') {
            tempstring[0] = '\0';
            tempstring[1] = '\0';
            tempstring[2] = '\0';
            tempstring[3] = '\0';
            IOBuf[0] = '\0';
            IOBuf[1] = '\0';
            do {
              _Var5 = waitpid(-1,(int *)tempstring,1);
              if (_Var5 != -1) {
                if ((0 < _Var5) && (tempstring[0] != '\x7f')) {
                  IOBuf[5] = (char)((uint)_Var5 >> 0x18);
                  IOBuf[4] = (char)((uint)_Var5 >> 0x10);
                  IOBuf[3] = tempstring[1];
                  IOBuf[2] = tempstring[0];
                  IOBuf[1] = (char)_Var5;
                  IOBuf[0] = (char)((uint)_Var5 >> 8);
                }
                break;
              }
              piVar9 = __errno_location();
            } while (*piVar9 == 4);
          }
          else if (IOBuf[0] == 'S') goto LAB_0010279f;
        }
LAB_00102a1e:
        write(UnixToLisp[1],IOBuf,6);
      } while( true );
    }
    if (uVar4 != 0xffffffff) {
      snprintf(tempstring,0x1e,"%d",(ulong)(uint)UnixToLisp[0]);
      setenv("LDEPIPEIN",tempstring,1);
      snprintf(tempstring,0x1e,"%d",(ulong)(uint)LispToUnix[1]);
      setenv("LDEPIPEOUT",tempstring,1);
      snprintf(tempstring,0x1e,"%ld",StartTime);
      setenv("LDESTARTTIME",tempstring,1);
      snprintf(tempstring,0x1e,"%d",(ulong)uVar4);
      setenv("LDEUNIXPID",tempstring,1);
      close(LispToUnix[0]);
      close(UnixToLisp[1]);
      return 1;
    }
    pcVar14 = "fork";
  }
  perror(pcVar14);
  iVar3 = -1;
  goto LAB_00102ad9;
  while (iVar3 = strcmp(__s1,pcVar10), iVar3 != 0) {
LAB_00102bca:
    pcVar10 = getusershell();
    if (pcVar10 == (char *)0x0) {
      pcVar14 = "$(SHELL) not found in /etc/shells";
      goto LAB_00102aed;
    }
  }
  local_1a8 = strrchr(pcVar10,0x2f);
  local_1a8 = local_1a8 + 1;
  if (*pcVar14 != '\0') {
    pcStack_1a0 = "-c";
    local_198 = pcVar14;
  }
  execv(pcVar10,&local_1a8);
  pcVar14 = "execv";
LAB_00102aed:
  perror(pcVar14);
LAB_00102af2:
  iVar3 = 1;
LAB_00102ad9:
  exit(iVar3);
}

Assistant:

int fork_Unix(void) {
  int LispToUnix[2], /* Incoming pipe from LISP */
      UnixToLisp[2], /* Outgoing pipe to LISP */
      UnixPID, LispPipeIn, LispPipeOut, slot;
  pid_t pid;
  sigset_t signals;

  char IOBuf[6]; /* XXX: signed, because slot comes from here */
  unsigned short tmp = 0;
  char *cmdstring;

  /* Pipes between LISP subr and process */
  if (pipe(LispToUnix) == -1) {
    perror("pipe");
    exit(-1);
  }
  if (pipe(UnixToLisp) == -1) {
    perror("pipe");
    exit(-1);
  }

  StartTime = time(0);   /* Save the time, to create filenames with */
  StartTime &= 0xFFFFFF; /* as a positive number! */

  /* interrupts need to be blocked here so subprocess won't see them */
  sigemptyset(&signals);
  sigaddset(&signals, SIGVTALRM);
#ifndef MAIKO_OS_HAIKU
  sigaddset(&signals, SIGIO);
#endif
  sigaddset(&signals, SIGALRM);
  sigaddset(&signals, SIGXFSZ);
  sigaddset(&signals, SIGFPE);
  sigprocmask(SIG_BLOCK, &signals, NULL);

  if ((UnixPID = fork()) == -1) { /* Fork off small version of the emulator */
    perror("fork");
    exit(-1);
  }

  if (UnixPID != 0) {
    /* JRB - fork_Unix is now called in ldeboot; leave UnixPipe{In,Out} open
       and put their numbers in the environment so parent can find them */
    /* JDS - NB that sprintf doesn't always return a string! */
    /* NHB - if the return value of snprintf() is greater than or equal to the
     * size argument, the string was too short and some of the printed
     * characters were discarded. However we're printing numbers, so we know
     * that the buffer is big enough
     */
    char tempstring[30];

    (void)snprintf(tempstring, sizeof(tempstring), "%d", UnixToLisp[0]);
    setenv("LDEPIPEIN", tempstring, 1);

    (void)snprintf(tempstring, sizeof(tempstring), "%d", LispToUnix[1]);
    setenv("LDEPIPEOUT", tempstring, 1);

    (void)snprintf(tempstring, sizeof(tempstring), "%ld", StartTime);
    setenv("LDESTARTTIME", tempstring, 1);

    (void)snprintf(tempstring, sizeof(tempstring), "%d", UnixPID);
    setenv("LDEUNIXPID", tempstring, 1);

    close(LispToUnix[0]);
    close(UnixToLisp[1]);
    return (1);
  }

  LispPipeIn = LispToUnix[0];
  LispPipeOut = UnixToLisp[1];
  close(LispToUnix[1]);
  close(UnixToLisp[0]);

  fcntl(LispPipeIn, F_SETFL, fcntl(LispPipeIn, F_GETFL, 0) & ~O_NONBLOCK);

  while (1) {
    ssize_t len;
    len = SAFEREAD(LispPipeIn, IOBuf, 6);
    if (len == 0)
      exit(0);
    if (len < 0) {
      perror("Error reading packet by slave");
      exit(1);
    } else if (len != 6) {
      DBPRINT(("Input packet wrong length: %zd", len));
      exit(1);
    }
    slot = (int)IOBuf[3];
    IOBuf[3] = 1; /* Start by signalling success in return-code */

    switch (IOBuf[0]) {
      case 'S':
      case 'P':          /* Fork PTY shell */
        if (slot >= 0) { /* Found a free slot */
          char termtype[64];
          char slavepty[32]; /* For slave pty name */

          if (SAFEREAD(LispPipeIn, (char *)&tmp, 2) < 0) perror("Slave reading slave pty len");
          if (SAFEREAD(LispPipeIn, slavepty, tmp) < 0) perror("Slave reading slave pty id");

          if (IOBuf[0] == 'P') { /* The new style, which takes term type & command to csh */
            if (SAFEREAD(LispPipeIn, (char *)&tmp, 2) < 0) perror("Slave reading cmd length");
            if (tmp > 63) perror("Slave termtype length too long");
            if (SAFEREAD(LispPipeIn, termtype, tmp) < 0) perror("Slave reading termtype");
            termtype[tmp] = '\0';
            if (SAFEREAD(LispPipeIn, (char *)&tmp, 2) < 0) perror("Slave reading cmd length");
            if (tmp > 510)
              cmdstring = (char *)malloc(tmp + 5);
            else
              cmdstring = shcom;

            if (SAFEREAD(LispPipeIn, cmdstring, tmp) < 0) perror("Slave reading shcom");
          } else /* old style, no args */
          {
            termtype[0] = 0;
            cmdstring = shcom;
            cmdstring[0] = 0;
          }

          /* Alloc a PTY and fork  */
          pid = ForkUnixShell(slot, slavepty, termtype, cmdstring);

          if (pid == -1) {
            printf("Impossible failure from ForkUnixShell??\n");
            fflush(stdout);
            IOBuf[3] = 0;
          } else {
            /* ForkUnixShell sets the pid and standard in/out variables */
            IOBuf[1] = (pid >> 8) & 0xFF;
            IOBuf[2] = pid & 0xFF;
            IOBuf[4] = (pid >> 16) & 0xFF;
            IOBuf[5] = (pid >> 24) & 0xFF;
          }
        } else {
          printf("Can't get process slot for PTY shell.\n");
          fflush(stdout);
          IOBuf[3] = 0;
        }
        break;

      case 'F': /* Fork pipe command */
        if (slot >= 0) {
          /* Read in the length of the shell command, and then the command */
          if (SAFEREAD(LispPipeIn, (char *)&tmp, 2) < 0) perror("Slave reading cmd length");
          if (tmp > 510)
            cmdstring = (char *)malloc(tmp + 5);
          else
            cmdstring = shcom;
          if (SAFEREAD(LispPipeIn, cmdstring, tmp) < 0) perror("Slave reading cmd");
          DBPRINT(("Cmd len = %d.\n", tmp));
          DBPRINT(("Rev'd cmd string: %s\n", cmdstring));
          pid = fork(); /* Fork */

          if (pid == 0) {
            int i;
            int status, sock;
            struct sockaddr_un addr;
            char PipeName[40];
            sock = socket(AF_UNIX, SOCK_STREAM, 0);
            if (sock < 0) {
              perror("slave socket");
              exit(1);
            }
            (void)snprintf(PipeName, sizeof(PipeName), "/tmp/LPU%ld-%d", StartTime, slot);
            memset(&addr, 0, sizeof(struct sockaddr_un));
            addr.sun_family = AF_UNIX;
            strcpy(addr.sun_path, PipeName);
            status =
                connect(sock, (struct sockaddr *)&addr, sizeof(struct sockaddr_un));
            if (status < 0) {
              perror("slave connect");
              printf("Name = %s.\n", PipeName);
              fflush(stdout);
              exit(1);
            } else {
              DBPRINT(("Slave connected on %s.\n", PipeName));
            }

            /* Copy the pipes onto stdin, stdout, and stderr */
            dup2(sock, 0);
            dup2(sock, 1);
            dup2(sock, 2);

            /* Make sure everything else is closed. */
            for (i = 3; i < sysconf(_SC_OPEN_MAX); i++) close(i);

            /* Run the shell command and get the result */
            status = system(cmdstring);
            if (cmdstring != shcom) free(cmdstring);
            /* Comment out to fix USAR 11302 (FXAR 320)
            unlink(PipeName);
            */
            _exit((status & ~0xff) ? (status >> 8) : status);
          }

          /* Check for error doing the fork */
          if (pid == (pid_t)-1) {
            perror("unixcomm: fork");
            IOBuf[3] = 0;
          } else {
            IOBuf[1] = (pid >> 8) & 0xFF;
            IOBuf[2] = pid & 0xFF;
            IOBuf[4] = (pid >> 16) & 0xFF;
            IOBuf[5] = (pid >> 24) & 0xFF;
          }
        } else {
          printf("No process slots available.\n");
          IOBuf[3] = 0; /* Couldn't get a process slot */
        }
        break;

      case 'W': /* Wait for a process to die. */
      {
        int status;

        status = 0;

        IOBuf[0] = 0;
        IOBuf[1] = 0;
        DBPRINT(("About to wait for processes.\n"));
      retry1:
        pid = waitpid(-1, &status, WNOHANG);
        if (pid == -1 && errno == EINTR) goto retry1;
        if (pid > 0) {
          /* Ignore processes which are suspended but haven't exited
             (this shouldn't happen) */
          if (WIFSTOPPED(status)) break;
          IOBuf[5] = (pid >> 24) & 0xFF;
          IOBuf[4] = (pid >> 16) & 0xFF;
          IOBuf[3] = status >> 8;
          IOBuf[2] = status & 0xFF;
          IOBuf[1] = pid & 0xFF;
          IOBuf[0] = (pid >> 8) & 0xFF;
        }
        DBPRINT(("wait3 returned pid = %ld.\n", (long)pid));
      }

      break;

      case 'C': /* Close stdin to subprocess */ break;

      case 'K': /* Kill subprocess */ break;
    } /* End of switch */

    /* Return the status/data packet */
    write(LispPipeOut, IOBuf, 6);
  }
}